

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandIRewriteSeq(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint fVerbose;
  char *pcVar5;
  uint fUseZeroCost;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  fUseZeroCost = 0;
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"lzvh");
  fVerbose = 0;
  if (iVar1 != -1) {
    fVerbose = 0;
    fUseZeroCost = 0;
    do {
      uVar2 = iVar1 - 0x68U >> 1 | (uint)((iVar1 - 0x68U & 1) != 0) << 0x1f;
      if (uVar2 != 2) {
        if (uVar2 == 7) {
          fVerbose = fVerbose ^ 1;
        }
        else {
          if (uVar2 != 9) {
            Abc_Print(-2,"usage: irws [-zvh]\n");
            Abc_Print(-2,"\t         perform sequential AIG rewriting\n");
            pcVar4 = "yes";
            pcVar5 = "yes";
            if (fUseZeroCost == 0) {
              pcVar5 = "no";
            }
            Abc_Print(-2,"\t-z     : toggle using zero-cost replacements [default = %s]\n",pcVar5);
            if (fVerbose == 0) {
              pcVar4 = "no";
            }
            Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar4);
            pcVar5 = "\t-h     : print the command usage\n";
            iVar1 = -2;
            goto LAB_0025e722;
          }
          fUseZeroCost = fUseZeroCost ^ 1;
        }
      }
      iVar1 = Extra_UtilGetopt(argc,argv,"lzvh");
    } while (iVar1 != -1);
  }
  if (pAVar3 == (Abc_Ntk_t *)0x0) {
    pcVar5 = "Empty network.\n";
  }
  else {
    if (pAVar3->ntkType == ABC_NTK_STRASH) {
      pAVar3 = Abc_NtkIvyRewriteSeq(pAVar3,fUseZeroCost,fVerbose);
      if (pAVar3 != (Abc_Ntk_t *)0x0) {
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
        return 0;
      }
      Abc_Print(-1,"Command has failed.\n");
      return 0;
    }
    pcVar5 = "This command works only for strashed networks.\n";
  }
  iVar1 = -1;
LAB_0025e722:
  Abc_Print(iVar1,pcVar5);
  return 1;
}

Assistant:

int Abc_CommandIRewriteSeq( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, fUpdateLevel, fUseZeroCost, fVerbose;
    extern Abc_Ntk_t * Abc_NtkIvyRewriteSeq( Abc_Ntk_t * pNtk, int fUseZeroCost, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fUpdateLevel = 0;
    fUseZeroCost = 0;
    fVerbose     = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "lzvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'z':
            fUseZeroCost ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }

    pNtkRes = Abc_NtkIvyRewriteSeq( pNtk, fUseZeroCost, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: irws [-zvh]\n" );
    Abc_Print( -2, "\t         perform sequential AIG rewriting\n" );
//    Abc_Print( -2, "\t-l     : toggle preserving the number of levels [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle using zero-cost replacements [default = %s]\n", fUseZeroCost? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}